

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  int iVar22;
  float *pfVar23;
  float *pfVar24;
  int *piVar25;
  float *pfVar26;
  float *pfVar27;
  double *pdVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  float *pfVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 in_XMM24 [16];
  
  pfVar39 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[parIndex];
  pfVar23 = (this->super_BeagleCPUImpl<float,_1,_0>).gTransitionMatrices[probIndex];
  pfVar24 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  memset((this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp,0,
         (long)(this->super_BeagleCPUImpl<float,_1,_0>).kStateCount *
         (long)(this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount * 4);
  if ((childIndex < (this->super_BeagleCPUImpl<float,_1,_0>).kTipCount) &&
     (piVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).gTipStates[childIndex],
     piVar25 != (int *)0x0)) {
    lVar29 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    if (0 < lVar29) {
      uVar21 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
      iVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
      pfVar26 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
      lVar35 = 0;
      iVar36 = 0;
      iVar37 = 0;
      do {
        if (0 < (int)uVar21) {
          fVar1 = pfVar24[lVar35];
          lVar38 = 0;
          do {
            iVar30 = *(int *)((long)piVar25 + lVar38);
            auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar23[iVar30 + iVar37] *
                                                    pfVar39[iVar36 + lVar38])),ZEXT416((uint)fVar1),
                                      ZEXT416((uint)pfVar26[lVar38]));
            pfVar26[lVar38] = auVar40._0_4_;
            auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar23[iVar37 + 5 + iVar30] *
                                                    pfVar39[(long)iVar36 + lVar38 + 1])),
                                      ZEXT416((uint)fVar1),ZEXT416((uint)pfVar26[lVar38 + 1]));
            pfVar26[lVar38 + 1] = auVar40._0_4_;
            auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar23[iVar37 + 10 + iVar30] *
                                                    pfVar39[(long)iVar36 + lVar38 + 2])),
                                      ZEXT416((uint)fVar1),ZEXT416((uint)pfVar26[lVar38 + 2]));
            pfVar26[lVar38 + 2] = auVar40._0_4_;
            auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar23[iVar30 + iVar37 + 0xf] *
                                                    pfVar39[(long)iVar36 + lVar38 + 3])),
                                      ZEXT416((uint)fVar1),ZEXT416((uint)pfVar26[lVar38 + 3]));
            pfVar26[lVar38 + 3] = auVar40._0_4_;
            lVar38 = lVar38 + 4;
          } while ((ulong)uVar21 << 2 != lVar38);
          iVar36 = iVar36 + (int)lVar38;
        }
        iVar36 = iVar36 + iVar22 * 4;
        iVar37 = iVar37 + 0x14;
        lVar35 = lVar35 + 1;
      } while (lVar35 != lVar29);
    }
  }
  else {
    lVar29 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    if (0 < lVar29) {
      pfVar26 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[childIndex];
      iVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
      iVar36 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
      pfVar27 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
      lVar35 = 0;
      lVar38 = 0;
      iVar37 = 0;
      do {
        if (0 < iVar22) {
          lVar31 = (long)iVar37;
          fVar1 = pfVar24[lVar35];
          fVar18 = pfVar23[lVar38];
          fVar19 = pfVar23[lVar38 + 1];
          fVar20 = pfVar23[lVar38 + 2];
          fVar2 = pfVar23[lVar38 + 3];
          fVar3 = pfVar23[lVar38 + 5];
          fVar4 = pfVar23[lVar38 + 6];
          fVar5 = pfVar23[lVar38 + 7];
          fVar6 = pfVar23[lVar38 + 8];
          fVar7 = pfVar23[lVar38 + 10];
          fVar8 = pfVar23[lVar38 + 0xb];
          fVar9 = pfVar23[lVar38 + 0xc];
          fVar10 = pfVar23[lVar38 + 0xd];
          fVar11 = pfVar23[lVar38 + 0xf];
          fVar12 = pfVar23[lVar38 + 0x10];
          fVar13 = pfVar23[lVar38 + 0x11];
          fVar14 = pfVar23[lVar38 + 0x12];
          lVar33 = 0xc;
          iVar30 = iVar22;
          do {
            uVar21 = *(uint *)((long)pfVar26 + lVar33 + lVar31 * 4 + -0xc);
            uVar15 = *(uint *)((long)pfVar26 + lVar33 + lVar31 * 4 + -8);
            uVar16 = *(uint *)((long)pfVar26 + lVar33 + lVar31 * 4 + -4);
            uVar17 = *(uint *)((long)pfVar26 + lVar33 + lVar31 * 4);
            auVar40 = vmulss_avx512f(ZEXT416((uint)fVar19),ZEXT416(uVar15));
            auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar18),ZEXT416(uVar21));
            auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar20),ZEXT416(uVar16));
            auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar2),ZEXT416(uVar17));
            auVar41 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416(uVar15));
            auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar3),ZEXT416(uVar21));
            auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar5),ZEXT416(uVar16));
            auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar6),ZEXT416(uVar17));
            auVar43 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(uVar15));
            auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar7),ZEXT416(uVar21));
            auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar9),ZEXT416(uVar16));
            auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar10),ZEXT416(uVar17));
            auVar42 = vmulss_avx512f(ZEXT416((uint)fVar12),ZEXT416(uVar15));
            auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar11),ZEXT416(uVar21));
            auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar13),ZEXT416(uVar16));
            auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar14),ZEXT416(uVar17));
            auVar40 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)pfVar39 +
                                                              lVar33 + lVar31 * 4 + -0xc)));
            auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar1),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33 + -0xc)));
            *(int *)((long)pfVar27 + lVar33 + -0xc) = auVar40._0_4_;
            auVar40 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)pfVar39 +
                                                              lVar33 + lVar31 * 4 + -8)));
            auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar1),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33 + -8)));
            *(int *)((long)pfVar27 + lVar33 + -8) = auVar40._0_4_;
            auVar40 = vmulss_avx512f(auVar43,ZEXT416(*(uint *)((long)pfVar39 +
                                                              lVar33 + lVar31 * 4 + -4)));
            auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar1),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33 + -4)));
            *(int *)((long)pfVar27 + lVar33 + -4) = auVar40._0_4_;
            auVar40 = vmulss_avx512f(auVar42,ZEXT416(*(uint *)((long)pfVar39 + lVar33 + lVar31 * 4))
                                    );
            auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar1),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33)));
            *(int *)((long)pfVar27 + lVar33) = auVar40._0_4_;
            lVar33 = lVar33 + 0x10;
            iVar30 = iVar30 + -1;
          } while (iVar30 != 0);
        }
        lVar38 = lVar38 + 0x14;
        lVar35 = lVar35 + 1;
        iVar37 = iVar37 + iVar36 * 4;
      } while (lVar35 != lVar29);
    }
  }
  uVar21 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
  uVar32 = (ulong)uVar21;
  if (0 < (int)uVar21) {
    pfVar39 = (this->super_BeagleCPUImpl<float,_1,_0>).gStateFrequencies[stateFrequenciesIndex];
    fVar1 = *pfVar39;
    fVar18 = pfVar39[1];
    fVar19 = pfVar39[2];
    fVar20 = pfVar39[3];
    pfVar39 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp + 3;
    lVar29 = 0;
    do {
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * pfVar39[-2])),ZEXT416((uint)fVar1),
                                ZEXT416((uint)pfVar39[-3]));
      auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar19),ZEXT416((uint)pfVar39[-1]));
      auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar20),ZEXT416((uint)*pfVar39));
      dVar44 = log((double)auVar40._0_4_);
      (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp[lVar29] = (float)dVar44;
      lVar29 = lVar29 + 1;
      uVar32 = (ulong)(this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
      pfVar39 = pfVar39 + 4;
    } while (lVar29 < (long)uVar32);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar32)) {
    pfVar39 = (this->super_BeagleCPUImpl<float,_1,_0>).gScaleBuffers[scalingFactorsIndex];
    pfVar23 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
    uVar34 = 0;
    do {
      pfVar23[uVar34] = pfVar39[uVar34] + pfVar23[uVar34];
      uVar34 = uVar34 + 1;
    } while ((uVar32 & 0xffffffff) != uVar34);
  }
  *outSumLogLikelihood = 0.0;
  if (0 < (int)uVar32) {
    pdVar28 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternWeights;
    pfVar39 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
    auVar40 = ZEXT816(0) << 0x40;
    uVar34 = 0;
    do {
      auVar43 = vcvtss2sd_avx512f(in_XMM24,ZEXT416((uint)pfVar39[uVar34]));
      auVar41._8_8_ = 0;
      auVar41._0_8_ = pdVar28[uVar34];
      auVar40 = vfmadd231sd_fma(auVar40,auVar43,auVar41);
      *outSumLogLikelihood = auVar40._0_8_;
      uVar34 = uVar34 + 1;
    } while ((uVar32 & 0xffffffff) != uVar34);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}